

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleParameters::TreeEnsembleParameters(TreeEnsembleParameters *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleParameters_00708608;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->nodes_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->nodes_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->nodes_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->nodes_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->basepredictionvalue_).current_size_ = 0;
  (this->basepredictionvalue_).total_size_ = 0;
  (this->basepredictionvalue_).rep_ = (Rep *)0x0;
  if (this != (TreeEnsembleParameters *)&_TreeEnsembleParameters_default_instance_) {
    protobuf_TreeEnsemble_2eproto::InitDefaults();
  }
  this->numpredictiondimensions_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

TreeEnsembleParameters::TreeEnsembleParameters()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_TreeEnsemble_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.TreeEnsembleParameters)
}